

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::LocalSingleStoreElimPass::FindSingleStoreAndCheckUses
          (LocalSingleStoreElimPass *this,Instruction *var_inst,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *users
          )

{
  uint uVar1;
  Op OVar2;
  pointer ppIVar3;
  Instruction *this_00;
  bool bVar4;
  uint32_t uVar5;
  CommonDebugInfoInstructions CVar6;
  pointer ppIVar7;
  
  uVar5 = Instruction::NumInOperands(var_inst);
  if (uVar5 < 2) {
    var_inst = (Instruction *)0x0;
  }
  ppIVar7 = (users->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppIVar3 = (users->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppIVar7 == ppIVar3) {
      return var_inst;
    }
    this_00 = *ppIVar7;
    OVar2 = this_00->opcode_;
    uVar1 = OVar2 - OpImageTexelPointer;
    if (uVar1 < 0x18) {
      if ((0x800003U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0x60U >> (uVar1 & 0x1f) & 1) == 0) {
          if (uVar1 != 2) goto LAB_0020d629;
          bVar4 = var_inst != (Instruction *)0x0;
          var_inst = this_00;
          if (bVar4) {
            return (Instruction *)0x0;
          }
        }
        else {
          bVar4 = FeedsAStore(this,this_00);
          if (bVar4) {
            return (Instruction *)0x0;
          }
        }
      }
    }
    else {
LAB_0020d629:
      if (OVar2 != OpName) {
        if (OVar2 == OpExtInst) {
          CVar6 = Instruction::GetCommonDebugOpcode(this_00);
          if ((CVar6 & ~CommonDebugInfoDebugCompilationUnit) != CommonDebugInfoDebugDeclare) {
            return (Instruction *)0x0;
          }
        }
        else {
          bVar4 = Instruction::IsDecoration(this_00);
          if (!bVar4) {
            return (Instruction *)0x0;
          }
        }
      }
    }
    ppIVar7 = ppIVar7 + 1;
  } while( true );
}

Assistant:

Instruction* LocalSingleStoreElimPass::FindSingleStoreAndCheckUses(
    Instruction* var_inst, const std::vector<Instruction*>& users) const {
  // Make sure there is exactly 1 store.
  Instruction* store_inst = nullptr;

  // If |var_inst| has an initializer, then that will count as a store.
  if (var_inst->NumInOperands() > 1) {
    store_inst = var_inst;
  }

  for (Instruction* user : users) {
    switch (user->opcode()) {
      case spv::Op::OpStore:
        // Since we are in the relaxed addressing mode, the use has to be the
        // base address of the store, and not the value being store.  Otherwise,
        // we would have a pointer to a pointer to function scope memory, which
        // is not allowed.
        if (store_inst == nullptr) {
          store_inst = user;
        } else {
          // More than 1 store.
          return nullptr;
        }
        break;
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain:
        if (FeedsAStore(user)) {
          // Has a partial store.  Cannot propagate that.
          return nullptr;
        }
        break;
      case spv::Op::OpLoad:
      case spv::Op::OpImageTexelPointer:
      case spv::Op::OpName:
      case spv::Op::OpCopyObject:
        break;
      case spv::Op::OpExtInst: {
        auto dbg_op = user->GetCommonDebugOpcode();
        if (dbg_op == CommonDebugInfoDebugDeclare ||
            dbg_op == CommonDebugInfoDebugValue) {
          break;
        }
        return nullptr;
      }
      default:
        if (!user->IsDecoration()) {
          // Don't know if this instruction modifies the variable.
          // Conservatively assume it is a store.
          return nullptr;
        }
        break;
    }
  }
  return store_inst;
}